

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void tcmalloc::LLA_SkiplistDelete(AllocList *head,AllocList *e,AllocList **prev)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  AllocList *pAVar5;
  ulong uVar6;
  AllocList *pAVar7;
  
  iVar1 = head->levels;
  uVar4 = (ulong)iVar1;
  uVar6 = uVar4;
  pAVar5 = head;
  if (0 < (long)uVar4) {
    do {
      do {
        pAVar7 = pAVar5;
        pAVar5 = pAVar7->next[uVar6 - 1];
        if (pAVar5 == (AllocList *)0x0) break;
      } while (pAVar5 < e);
      prev[uVar6 - 1] = pAVar7;
      bVar3 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
      pAVar5 = pAVar7;
    } while (bVar3);
  }
  if (iVar1 == 0) {
    pAVar5 = (AllocList *)0x0;
  }
  else {
    pAVar5 = (*prev)->next[0];
  }
  if (pAVar5 != e) {
    syscall(1,2,"Check failed: e == found: element not in freelist\n",0x32);
    abort();
  }
  uVar2 = e->levels;
  if ((ulong)uVar2 != 0) {
    uVar6 = 0;
    do {
      if (prev[uVar6]->next[uVar6] != e) break;
      prev[uVar6]->next[uVar6] = e->next[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  if (0 < iVar1) {
    do {
      if (head->next[uVar4 - 1] != (AllocList *)0x0) {
        return;
      }
      head->levels = (int)uVar4 + -1;
      bVar3 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

static void LLA_SkiplistDelete(AllocList *head, AllocList *e,
                               AllocList **prev) {
  AllocList *found = LLA_SkiplistSearch(head, e, prev);
  RAW_CHECK(e == found, "element not in freelist");
  for (int i = 0; i != e->levels && prev[i]->next[i] == e; i++) {
    prev[i]->next[i] = e->next[i];
  }
  while (head->levels > 0 && head->next[head->levels - 1] == 0) {
    head->levels--;   // reduce head->levels if level unused
  }
}